

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

void sg_init_shader(sg_shader shd_id,sg_shader_desc *desc)

{
  _sg_shader_t *shd;
  sg_shader_desc desc_def;
  sg_shader_desc sStack_bf8;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e16,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
  }
  _sg_shader_desc_defaults(&sStack_bf8,desc);
  if (shd_id.id != 0) {
    shd = _sg_shader_at(&_sg.pools,shd_id.id);
    if ((shd->slot).id == shd_id.id) {
      if ((shd->slot).state != SG_RESOURCESTATE_ALLOC) {
        if (_sg.desc.logger.log_cb != (_func_void_char_ptr_void_ptr *)0x0) {
          (*_sg.desc.logger.log_cb)
                    ("sg_init_shader: shader must be in alloc state\n",_sg.desc.logger.user_data);
          return;
        }
        puts("sg_init_shader: shader must be in alloc state\n");
        return;
      }
      _sg_init_shader(shd,&sStack_bf8);
      if (((shd->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
        __assert_fail("(shd->slot.state == SG_RESOURCESTATE_VALID) || (shd->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e1c,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
      }
    }
  }
  return;
}

Assistant:

inline void sg_init_shader(sg_shader shd_id, const sg_shader_desc& desc) { return sg_init_shader(shd_id, &desc); }